

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O0

void __thiscall webrtc::AudioProcessingImpl::UpdateHistogramsOnCallEnd(AudioProcessingImpl *this)

{
  Histogram *pHVar1;
  ostream *poVar2;
  allocator local_3f9;
  string local_3f8 [39];
  byte local_3d1;
  FatalMessage local_3d0;
  FatalMessageVoidify local_251;
  Histogram *local_250;
  Histogram *prev_pointer_1;
  string local_240 [32];
  Histogram *local_220;
  Histogram *histogram_pointer_1;
  string local_210 [39];
  byte local_1e9;
  FatalMessage local_1e8;
  FatalMessageVoidify local_69;
  Histogram *local_68;
  Histogram *prev_pointer;
  string local_58 [32];
  Histogram *local_38;
  Histogram *histogram_pointer;
  CritScope local_20;
  CritScope cs_capture;
  CritScope cs_render;
  AudioProcessingImpl *this_local;
  
  rtc::CritScope::CritScope(&cs_capture,&this->crit_render_);
  rtc::CritScope::CritScope(&local_20,&this->crit_capture_);
  if (-1 < (this->capture_).stream_delay_jumps) {
    local_38 = rtc::AtomicOps::AcquireLoadPtr<webrtc::metrics::Histogram>
                         (&UpdateHistogramsOnCallEnd::atomic_histogram_pointer);
    if (local_38 == (Histogram *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_58,"WebRTC.Audio.NumOfPlatformReportedStreamDelayJumps",
                 (allocator *)((long)&prev_pointer + 7));
      local_38 = metrics::HistogramFactoryGetEnumeration((string *)local_58,0x33);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)((long)&prev_pointer + 7));
      local_68 = rtc::AtomicOps::CompareAndSwapPtr<webrtc::metrics::Histogram>
                           (&UpdateHistogramsOnCallEnd::atomic_histogram_pointer,(Histogram *)0x0,
                            local_38);
      local_1e9 = 0;
      if ((local_68 != (Histogram *)0x0) && (local_68 != local_38)) {
        rtc::FatalMessageVoidify::FatalMessageVoidify(&local_69);
        rtc::FatalMessage::FatalMessage
                  (&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/audio_processing_impl.cc"
                   ,0x528);
        local_1e9 = 1;
        poVar2 = rtc::FatalMessage::stream(&local_1e8);
        poVar2 = std::operator<<(poVar2,
                                 "Check failed: prev_pointer == nullptr || prev_pointer == histogram_pointer"
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,"# ");
        rtc::FatalMessageVoidify::operator&(&local_69,poVar2);
      }
      if ((local_1e9 & 1) != 0) {
        rtc::FatalMessage::~FatalMessage(&local_1e8);
      }
    }
    pHVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_210,"WebRTC.Audio.NumOfPlatformReportedStreamDelayJumps",
               (allocator *)((long)&histogram_pointer_1 + 7));
    metrics::HistogramAdd(pHVar1,(string *)local_210,(this->capture_).stream_delay_jumps);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)((long)&histogram_pointer_1 + 7));
  }
  (this->capture_).stream_delay_jumps = -1;
  (this->capture_).last_stream_delay_ms = 0;
  if (-1 < (this->capture_).aec_system_delay_jumps) {
    local_220 = rtc::AtomicOps::AcquireLoadPtr<webrtc::metrics::Histogram>
                          (&UpdateHistogramsOnCallEnd()::atomic_histogram_pointer);
    if (local_220 == (Histogram *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_240,"WebRTC.Audio.NumOfAecSystemDelayJumps",
                 (allocator *)((long)&prev_pointer_1 + 7));
      local_220 = metrics::HistogramFactoryGetEnumeration((string *)local_240,0x33);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator((allocator<char> *)((long)&prev_pointer_1 + 7));
      local_250 = rtc::AtomicOps::CompareAndSwapPtr<webrtc::metrics::Histogram>
                            (&UpdateHistogramsOnCallEnd()::atomic_histogram_pointer,(Histogram *)0x0
                             ,local_220);
      local_3d1 = 0;
      if ((local_250 != (Histogram *)0x0) && (local_250 != local_220)) {
        rtc::FatalMessageVoidify::FatalMessageVoidify(&local_251);
        rtc::FatalMessage::FatalMessage
                  (&local_3d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/audio_processing_impl.cc"
                   ,0x52f);
        local_3d1 = 1;
        poVar2 = rtc::FatalMessage::stream(&local_3d0);
        poVar2 = std::operator<<(poVar2,
                                 "Check failed: prev_pointer == nullptr || prev_pointer == histogram_pointer"
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,"# ");
        rtc::FatalMessageVoidify::operator&(&local_251,poVar2);
      }
      if ((local_3d1 & 1) != 0) {
        rtc::FatalMessage::~FatalMessage(&local_3d0);
      }
    }
    pHVar1 = local_220;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"WebRTC.Audio.NumOfAecSystemDelayJumps",&local_3f9);
    metrics::HistogramAdd(pHVar1,(string *)local_3f8,(this->capture_).aec_system_delay_jumps);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  }
  (this->capture_).aec_system_delay_jumps = -1;
  (this->capture_).last_aec_system_delay_ms = 0;
  rtc::CritScope::~CritScope(&local_20);
  rtc::CritScope::~CritScope(&cs_capture);
  return;
}

Assistant:

void AudioProcessingImpl::UpdateHistogramsOnCallEnd() {
  // Run in a single-threaded manner.
  rtc::CritScope cs_render(&crit_render_);
  rtc::CritScope cs_capture(&crit_capture_);

  if (capture_.stream_delay_jumps > -1) {
    RTC_HISTOGRAM_ENUMERATION(
        "WebRTC.Audio.NumOfPlatformReportedStreamDelayJumps",
        capture_.stream_delay_jumps, 51);
  }
  capture_.stream_delay_jumps = -1;
  capture_.last_stream_delay_ms = 0;

  if (capture_.aec_system_delay_jumps > -1) {
    RTC_HISTOGRAM_ENUMERATION("WebRTC.Audio.NumOfAecSystemDelayJumps",
                              capture_.aec_system_delay_jumps, 51);
  }
  capture_.aec_system_delay_jumps = -1;
  capture_.last_aec_system_delay_ms = 0;
}